

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

void __thiscall
MeCab::FreeList<MeCab::NBestGenerator::QueueElement>::~FreeList
          (FreeList<MeCab::NBestGenerator::QueueElement> *this)

{
  pointer ppQVar1;
  QueueElement *pQVar2;
  ulong uVar3;
  
  this->_vptr_FreeList = (_func_int **)&PTR__FreeList_0019ec08;
  uVar3 = 0;
  while( true ) {
    this->li_ = uVar3;
    ppQVar1 = (this->freeList).
              super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->freeList).
                      super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppQVar1 >> 3) <= uVar3)
    break;
    pQVar2 = ppQVar1[uVar3];
    if (pQVar2 != (QueueElement *)0x0) {
      operator_delete__(pQVar2);
      uVar3 = this->li_;
    }
    uVar3 = uVar3 + 1;
  }
  std::
  _Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
  ::~_Vector_base(&(this->freeList).
                   super__Vector_base<MeCab::NBestGenerator::QueueElement_*,_std::allocator<MeCab::NBestGenerator::QueueElement_*>_>
                 );
  return;
}

Assistant:

virtual ~FreeList() {
    for (li_ = 0; li_ < freeList.size(); li_++)
      delete [] freeList[li_];
  }